

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O2

SymbolPairChecker * __thiscall
my_algorithm::SymbolPairChecker::operator=(SymbolPairChecker *this,SymbolPairChecker *checker)

{
  Stack<char> SStack_38;
  
  this->_cursor = checker->_cursor;
  std::__cxx11::string::_M_assign((string *)&this->_open_symbols);
  std::__cxx11::string::_M_assign((string *)&this->_close_symbols);
  data_structures::Stack<char>::Stack(&SStack_38);
  data_structures::LinkedList<char>::operator=(&(this->_stack)._list,&SStack_38._list);
  data_structures::Stack<char>::~Stack(&SStack_38);
  return this;
}

Assistant:

SymbolPairChecker& SymbolPairChecker::operator=(const SymbolPairChecker &checker) {
        _cursor = checker._cursor;
        _open_symbols = checker._open_symbols;
        _close_symbols = checker._close_symbols;
        _stack = data_structures::Stack<char>();
        return *this;
    }